

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

__pid_t __thiscall
kj::Promise<kj::Array<unsigned_char>_>::wait
          (Promise<kj::Array<unsigned_char>_> *this,void *__stat_loc)

{
  anon_union_344_1_a8c68091_for_NullableValue<kj::Exception>_2 *exception;
  long lVar1;
  PromiseNode *pPVar2;
  WaitScope *in_RDX;
  long *plVar3;
  ExceptionOr<kj::Array<unsigned_char>_> result;
  ExceptionOrValue local_1a8;
  char local_48;
  long local_40;
  PromiseNode *pPStack_38;
  Disposer *local_30;
  
  local_1a8.exception.ptr.isSet = false;
  local_48 = '\0';
  _::waitImpl((Own<kj::_::PromiseNode> *)__stat_loc,&local_1a8,in_RDX);
  plVar3 = (long *)0x0;
  if (local_48 != '\0') {
    plVar3 = &local_40;
  }
  if (local_48 == '\x01') {
    exception = &local_1a8.exception.ptr.field_1;
    if (local_1a8.exception.ptr.isSet != false) {
      throwRecoverableException(&exception->value,0);
    }
    (this->super_PromiseBase).node.disposer = (Disposer *)*plVar3;
    (this->super_PromiseBase).node.ptr = pPStack_38;
    this[1].super_PromiseBase.node.disposer = local_30;
    *plVar3 = 0;
    lVar1 = local_40;
    plVar3[1] = 0;
    pPVar2 = pPStack_38;
    if ((local_48 == '\x01') && (local_40 != 0)) {
      local_40 = 0;
      pPStack_38 = (PromiseNode *)0x0;
      (**local_30->_vptr_Disposer)(local_30,lVar1,1,pPVar2,pPVar2,0);
    }
    if (local_1a8.exception.ptr.isSet == true) {
      Exception::~Exception(&exception->value);
    }
    return (__pid_t)this;
  }
  if (local_1a8.exception.ptr.isSet != false) {
    throwFatalException(&local_1a8.exception.ptr.field_1.value,0);
  }
  _::unreachable();
}

Assistant:

T Promise<T>::wait(WaitScope& waitScope) {
  _::ExceptionOr<_::FixVoid<T>> result;

  _::waitImpl(kj::mv(node), result, waitScope);

  KJ_IF_MAYBE(value, result.value) {
    KJ_IF_MAYBE(exception, result.exception) {
      throwRecoverableException(kj::mv(*exception));
    }
    return _::returnMaybeVoid(kj::mv(*value));
  } else KJ_IF_MAYBE(exception, result.exception) {
    throwFatalException(kj::mv(*exception));
  } else {
    // Result contained neither a value nor an exception?
    KJ_UNREACHABLE;
  }